

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O2

void __thiscall Saturation::SaturationAlgorithm::onNewClause(SaturationAlgorithm *this,Clause *cl)

{
  AnswerLiteralManager *pAVar1;
  bool bVar2;
  ostream *poVar3;
  string local_40;
  
  if (this->_splitter != (Splitter *)0x0) {
    Splitter::onNewClause(this->_splitter,cl);
  }
  if ((*(char *)(Lib::env + 0x913a) != '\0') || ((*(byte *)(Lib::env + 0x959a) & 1) != 0)) {
    poVar3 = std::operator<<((ostream *)&std::cout,"[SA] new: ");
    Kernel::Clause::toString_abi_cxx11_(&local_40,cl);
    poVar3 = std::operator<<(poVar3,(string *)&local_40);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_40);
  }
  bVar2 = Kernel::Clause::isPropositional(cl);
  if (bVar2) {
    onNewUsefulPropositionalClause(this,cl);
  }
  pAVar1 = this->_answerLiteralManager;
  if (pAVar1 != (AnswerLiteralManager *)0x0) {
    (*pAVar1->_vptr_AnswerLiteralManager[3])(pAVar1,cl);
  }
  return;
}

Assistant:

void SaturationAlgorithm::onNewClause(Clause* cl)
{
#if VDEBUG && VZ3
  if (cl->isPureTheoryDescendant()){
    bool couldNotCheck = false;
    ASS_REP(TheoryInstAndSimp::isTheoryLemma(cl,couldNotCheck),cl->toString())
  }
#endif

  if (_splitter) {
    _splitter->onNewClause(cl);
  }

  if (env.options->showNew()) {
    std::cout << "[SA] new: " << cl->toString() << std::endl;
  }

  if (cl->isPropositional()) {
    onNewUsefulPropositionalClause(cl);
  }

  if (_answerLiteralManager) {
    _answerLiteralManager->onNewClause(cl);
  }
}